

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

shared_ptr<vmips::Function> __thiscall
vmips::Module::create_function(Module *this,string *fname,size_t argc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::Function> sVar1;
  undefined1 local_31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (this->global_data_section).
  super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::Function,std::allocator<vmips::Function>,std::__cxx11::string,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->global_data_section).
              super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(Function **)this,
             (allocator<vmips::Function> *)&local_31,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argc,
             (unsigned_long *)&stack0xffffffffffffffe0);
  Function::entry((Function *)&stack0xffffffffffffffd0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  std::vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
  ::push_back((vector<std::shared_ptr<vmips::Function>,_std::allocator<std::shared_ptr<vmips::Function>_>_>
               *)((long)&fname->field_2 + 8),(value_type *)this);
  sVar1.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<vmips::Function>)
         sVar1.super___shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Function> Module::create_function(std::string fname, size_t argc) {
    auto function = std::make_shared<Function>(std::move(fname), argc);
    function->entry();
    functions.push_back(function);
    return function;
}